

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O3

void __thiscall cmSourceFileLocation::DirectoryUseSource(cmSourceFileLocation *this)

{
  char *in_base;
  string local_38;
  
  if (this->Makefile != (cmMakefile *)0x0) {
    if (this->AmbiguousDirectory == true) {
      in_base = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_38,&this->Directory,in_base);
      std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      this->AmbiguousDirectory = false;
    }
    return;
  }
  __assert_fail("this->Makefile",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSourceFileLocation.cxx"
                ,0x5a,"void cmSourceFileLocation::DirectoryUseSource()");
}

Assistant:

void cmSourceFileLocation::DirectoryUseSource()
{
  assert(this->Makefile);
  if(this->AmbiguousDirectory)
    {
    this->Directory =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentSourceDirectory());
    this->AmbiguousDirectory = false;
    }
}